

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_text_clamp(nk_user_font *font,char *text,int text_len,float space,int *glyphs,
                 float *text_width,nk_rune *sep_list,int sep_count)

{
  bool bVar1;
  int iVar2;
  float local_80;
  float local_7c;
  float local_70;
  nk_rune local_6c;
  float local_68;
  float sep_width;
  int sep_g;
  int sep_len;
  float s;
  int g;
  int len;
  float width;
  nk_rune unicode;
  float last_width;
  int glyph_len;
  int i;
  nk_rune *sep_list_local;
  float *text_width_local;
  int *glyphs_local;
  float space_local;
  int text_len_local;
  char *text_local;
  nk_user_font *font_local;
  
  last_width = 0.0;
  unicode = 0;
  width = 0.0;
  len = 0;
  g = 0;
  s = 0.0;
  sep_len = 0;
  sep_width = 0.0;
  local_68 = 0.0;
  local_6c = 0;
  if (sep_count < 0) {
    local_70 = 0.0;
  }
  else {
    local_70 = (float)sep_count;
  }
  _glyph_len = sep_list;
  sep_list_local = (nk_rune *)text_width;
  text_width_local = (float *)glyphs;
  glyphs_local._0_4_ = space;
  glyphs_local._4_4_ = text_len;
  _space_local = text;
  text_local = (char *)font;
  unicode = nk_utf_decode(text,(nk_rune *)&len,text_len);
  do {
    bVar1 = false;
    if ((unicode != 0) && (bVar1 = false, (float)g < glyphs_local._0_4_)) {
      bVar1 = (int)s < glyphs_local._4_4_;
    }
    if (!bVar1) {
      if ((int)s < glyphs_local._4_4_) {
        *text_width_local = local_68;
        *sep_list_local = local_6c;
        if (sep_width == 0.0) {
          local_80 = s;
        }
        else {
          local_80 = sep_width;
        }
        font_local._4_4_ = local_80;
      }
      else {
        *text_width_local = (float)sep_len;
        *sep_list_local = (nk_rune)width;
        font_local._4_4_ = s;
      }
      return (int)font_local._4_4_;
    }
    s = (float)(unicode + (int)s);
    iVar2 = (**(code **)(text_local + 0x10))
                      (*(undefined4 *)(text_local + 8),*(undefined8 *)text_local,_space_local,s);
    for (last_width = 0.0; (int)last_width < (int)local_70;
        last_width = (float)((int)last_width + 1)) {
      if (len == _glyph_len[(int)last_width]) {
        width = (float)g;
        local_6c = g;
        local_68 = (float)(sep_len + 1);
        sep_width = s;
        break;
      }
    }
    if ((int)local_70 < 0) {
      local_7c = 0.0;
    }
    else {
      local_7c = local_70;
    }
    if (last_width == local_7c) {
      local_6c = g;
      width = (float)g;
      local_68 = (float)(sep_len + 1);
    }
    unicode = nk_utf_decode(_space_local + (int)s,(nk_rune *)&len,glyphs_local._4_4_ - (int)s);
    sep_len = sep_len + 1;
    g = iVar2;
  } while( true );
}

Assistant:

NK_INTERN int
nk_text_clamp(const struct nk_user_font *font, const char *text,
    int text_len, float space, int *glyphs, float *text_width,
    nk_rune *sep_list, int sep_count)
{
    int i = 0;
    int glyph_len = 0;
    float last_width = 0;
    nk_rune unicode = 0;
    float width = 0;
    int len = 0;
    int g = 0;
    float s;

    int sep_len = 0;
    int sep_g = 0;
    float sep_width = 0;
    sep_count = NK_MAX(sep_count,0);

    glyph_len = nk_utf_decode(text, &unicode, text_len);
    while (glyph_len && (width < space) && (len < text_len)) {
        len += glyph_len;
        s = font->width(font->userdata, font->height, text, len);
        for (i = 0; i < sep_count; ++i) {
            if (unicode != sep_list[i]) continue;
            sep_width = last_width = width;
            sep_g = g+1;
            sep_len = len;
            break;
        }
        if (i == NK_MAX(sep_count,0)){
            last_width = sep_width = width;
            sep_g = g+1;
        }
        width = s;
        glyph_len = nk_utf_decode(&text[len], &unicode, text_len - len);
        g++;
    }
    if (len >= text_len) {
        *glyphs = g;
        *text_width = last_width;
        return len;
    } else {
        *glyphs = sep_g;
        *text_width = sep_width;
        return (!sep_len) ? len: sep_len;
    }
}